

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetMultiChannelF0
               (double *f0,int f0_length,int *boundary_list,int number_of_boundaries,
               double **multi_channel_f0)

{
  int j_2;
  int j_1;
  int j;
  int i;
  double **multi_channel_f0_local;
  int number_of_boundaries_local;
  int *boundary_list_local;
  int f0_length_local;
  double *f0_local;
  
  for (i = 0; i < number_of_boundaries / 2; i = i + 1) {
    for (j = 0; j < boundary_list[i << 1]; j = j + 1) {
      multi_channel_f0[i][j] = 0.0;
    }
    for (j_1 = boundary_list[i << 1]; j_1 <= boundary_list[i * 2 + 1]; j_1 = j_1 + 1) {
      multi_channel_f0[i][j_1] = f0[j_1];
    }
    j_2 = boundary_list[i * 2 + 1];
    while (j_2 = j_2 + 1, j_2 < f0_length) {
      multi_channel_f0[i][j_2] = 0.0;
    }
  }
  return;
}

Assistant:

static void GetMultiChannelF0(const double *f0, int f0_length,
    const int *boundary_list, int number_of_boundaries,
    double **multi_channel_f0) {
  for (int i = 0; i < number_of_boundaries / 2; ++i) {
    for (int j = 0; j < boundary_list[i * 2]; ++j)
      multi_channel_f0[i][j] = 0.0;
    for (int j = boundary_list[i * 2]; j <= boundary_list[i * 2 + 1]; ++j)
      multi_channel_f0[i][j] = f0[j];
    for (int j = boundary_list[i * 2 + 1] + 1; j < f0_length; ++j)
      multi_channel_f0[i][j] = 0.0;
  }
}